

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_ssse3.c
# Opt level: O0

__m128i filter_vert_kernel(__m128i *s,int16_t *filter)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long in_RDI;
  __m128i alVar3;
  __m128i temp;
  __m128i ss [4];
  undefined1 local_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined1 uStack_84;
  undefined1 uStack_83;
  undefined1 uStack_82;
  undefined1 uStack_81;
  undefined1 local_78;
  undefined1 uStack_77;
  undefined1 uStack_76;
  undefined1 uStack_75;
  undefined1 uStack_74;
  undefined1 uStack_73;
  undefined1 uStack_72;
  undefined1 uStack_71;
  
  uVar1 = *(undefined8 *)(in_RDI + 0x60);
  uVar2 = *(undefined8 *)(in_RDI + 0x70);
  local_78 = (undefined1)uVar1;
  uStack_77 = (undefined1)((ulong)uVar1 >> 8);
  uStack_76 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_75 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_74 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_73 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_72 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_71 = (undefined1)((ulong)uVar1 >> 0x38);
  local_88 = (undefined1)uVar2;
  uStack_87 = (undefined1)((ulong)uVar2 >> 8);
  uStack_86 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_85 = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_84 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_83 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_82 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_81 = (undefined1)((ulong)uVar2 >> 0x38);
  alVar3 = shuffle_filter_convolve8_8_ssse3
                     ((__m128i *)
                      CONCAT17(uStack_81,
                               CONCAT16(uStack_71,
                                        CONCAT15(uStack_82,
                                                 CONCAT14(uStack_72,
                                                          CONCAT13(uStack_83,
                                                                   CONCAT12(uStack_73,
                                                                            CONCAT11(uStack_84,
                                                                                     uStack_74))))))
                              ),
                      (int16_t *)
                      CONCAT17(uStack_85,
                               CONCAT16(uStack_75,
                                        CONCAT15(uStack_86,
                                                 CONCAT14(uStack_76,
                                                          CONCAT13(uStack_87,
                                                                   CONCAT12(uStack_77,
                                                                            CONCAT11(local_88,
                                                  local_78))))))));
  alVar3[0] = alVar3[0];
  alVar3[1] = alVar3[1];
  return alVar3;
}

Assistant:

static __m128i filter_vert_kernel(const __m128i *const s,
                                  const int16_t *const filter) {
  __m128i ss[4];
  __m128i temp;

  // 00 10 01 11 02 12 03 13
  ss[0] = _mm_unpacklo_epi8(s[0], s[1]);
  // 20 30 21 31 22 32 23 33
  ss[1] = _mm_unpacklo_epi8(s[2], s[3]);
  // 40 50 41 51 42 52 43 53
  ss[2] = _mm_unpacklo_epi8(s[4], s[5]);
  // 60 70 61 71 62 72 63 73
  ss[3] = _mm_unpacklo_epi8(s[6], s[7]);

  temp = shuffle_filter_convolve8_8_ssse3(ss, filter);
  // shrink to 8 bit each 16 bits
  return _mm_packus_epi16(temp, temp);
}